

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
::write_decimal<int>
          (basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
           *this,int value)

{
  char *__last;
  vector<wchar_t,_std::allocator<wchar_t>_> *this_00;
  iterator __position;
  char *pcVar1;
  back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> bVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  wchar_t local_28 [4];
  
  uVar6 = (ulong)(uint)-value;
  if (0 < value) {
    uVar6 = (ulong)(uint)value;
  }
  uVar4 = (uint)uVar6;
  uVar5 = 0x1f;
  if ((uVar4 | 1) != 0) {
    for (; (uVar4 | 1) >> uVar5 == 0; uVar5 = uVar5 - 1) {
    }
  }
  uVar8 = (uVar5 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
  uVar5 = *(uint *)(internal::basic_data<void>::ZERO_OR_POWERS_OF_10_32 + (ulong)uVar8 * 4);
  if (value < 0) {
    local_28[0] = L'-';
    this_00 = (this->out_).container;
    __position._M_current =
         (this_00->super__Vector_base<wchar_t,_std::allocator<wchar_t>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this_00->super__Vector_base<wchar_t,_std::allocator<wchar_t>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<wchar_t,_std::allocator<wchar_t>_>::_M_realloc_insert<wchar_t>
                (this_00,__position,local_28);
    }
    else {
      *__position._M_current = L'-';
      (this_00->super__Vector_base<wchar_t,_std::allocator<wchar_t>_>)._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
  }
  __last = (char *)((long)local_28 + (ulong)((uVar8 - (uVar4 < uVar5)) + 1));
  pcVar1 = __last;
  if (99 < uVar4) {
    do {
      uVar5 = (uint)uVar6;
      uVar4 = (uint)(uVar6 / 100);
      uVar6 = uVar6 / 100;
      *(undefined2 *)(pcVar1 + -2) =
           *(undefined2 *)
            (internal::basic_data<void>::DIGITS + (ulong)(uVar5 + (int)uVar6 * -100) * 2);
      pcVar1 = pcVar1 + -2;
    } while (9999 < uVar5);
  }
  bVar2.container = (this->out_).container;
  if (uVar4 < 10) {
    bVar3 = (byte)uVar4 | 0x30;
    lVar7 = -1;
  }
  else {
    pcVar1[-1] = internal::basic_data<void>::DIGITS[((ulong)uVar4 * 2 & 0xffffffff) + 1];
    bVar3 = internal::basic_data<void>::DIGITS[(ulong)uVar4 * 2];
    lVar7 = -2;
  }
  pcVar1[lVar7] = bVar3;
  bVar2 = std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<char*,std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>>
                    ((char *)local_28,__last,bVar2);
  (this->out_).container = bVar2.container;
  return;
}

Assistant:

void write_decimal(Int value) {
    typedef typename internal::int_traits<Int>::main_type main_type;
    main_type abs_value = static_cast<main_type>(value);
    bool is_negative = internal::is_negative(value);
    if (is_negative)
      abs_value = 0 - abs_value;
    int num_digits = internal::count_digits(abs_value);
    auto &&it = reserve((is_negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (is_negative)
      *it++ = static_cast<char_type>('-');
    it = internal::format_decimal<char_type>(it, abs_value, num_digits);
  }